

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O2

void __thiscall
cmDependsC::cmDependsC
          (cmDependsC *this,cmLocalGenerator *lg,char *targetDir,string *lang,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDepends::DependencyVector>_>_>
          *validDeps)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  cmMakefile *this_00;
  char *pcVar3;
  string complainRegexVar;
  string scanRegexVar;
  string complainRegex;
  string scanRegex;
  allocator local_d9;
  string *local_d8;
  RegularExpression *local_d0;
  RegularExpression *local_c8;
  RegularExpression *local_c0;
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *local_b8;
  string local_b0;
  string local_90;
  char *local_70 [4];
  char *local_50 [4];
  
  cmDepends::cmDepends(&this->super_cmDepends,lg,targetDir);
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsC_0059e2e8;
  (this->IncludeRegexLine).program = (char *)0x0;
  (this->IncludeRegexScan).program = (char *)0x0;
  (this->IncludeRegexComplain).program = (char *)0x0;
  (this->IncludeRegexLineString)._M_dataplus._M_p = (pointer)&(this->IncludeRegexLineString).field_2
  ;
  (this->IncludeRegexLineString)._M_string_length = 0;
  (this->IncludeRegexLineString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexScanString)._M_dataplus._M_p = (pointer)&(this->IncludeRegexScanString).field_2
  ;
  (this->IncludeRegexScanString)._M_string_length = 0;
  local_c0 = &this->IncludeRegexLine;
  local_c8 = &this->IncludeRegexScan;
  (this->IncludeRegexScanString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexComplainString)._M_dataplus._M_p =
       (pointer)&(this->IncludeRegexComplainString).field_2;
  (this->IncludeRegexComplainString)._M_string_length = 0;
  local_d0 = &this->IncludeRegexComplain;
  local_d8 = &this->IncludeRegexLineString;
  (this->IncludeRegexComplainString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexTransformString)._M_dataplus._M_p =
       (pointer)&(this->IncludeRegexTransformString).field_2;
  (this->IncludeRegexTransformString)._M_string_length = 0;
  (this->IncludeRegexTransformString).field_2._M_local_buf[0] = '\0';
  (this->IncludeRegexTransform).program = (char *)0x0;
  p_Var1 = &(this->TransformRules)._M_t._M_impl.super__Rb_tree_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->ValidDeps = validDeps;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->Encountered)._M_t._M_impl.super__Rb_tree_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_b8 = &this->Unscanned;
  std::
  queue<cmDependsC::UnscannedEntry,std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>>
  ::queue<std::deque<cmDependsC::UnscannedEntry,std::allocator<cmDependsC::UnscannedEntry>>,void>
            (local_b8);
  p_Var1 = &(this->FileCache)._M_t._M_impl.super__Rb_tree_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->FileCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->HeaderLocationCache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CacheFileName)._M_dataplus._M_p = (pointer)&(this->CacheFileName).field_2;
  (this->CacheFileName)._M_string_length = 0;
  psVar2 = &this->CacheFileName;
  (this->CacheFileName).field_2._M_local_buf[0] = '\0';
  this_00 = lg->Makefile;
  cmDepends::SetIncludePathFromLanguage(&this->super_cmDepends,lang);
  std::__cxx11::string::string((string *)local_50,"^.*$",(allocator *)local_70);
  std::__cxx11::string::string((string *)local_70,"^$",(allocator *)&local_90);
  std::__cxx11::string::string((string *)&local_90,"CMAKE_",(allocator *)&local_b0);
  std::__cxx11::string::append((string *)&local_90);
  std::__cxx11::string::append((char *)&local_90);
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_90);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::assign((char *)local_50);
  }
  std::__cxx11::string::string((string *)&local_b0,"CMAKE_",&local_d9);
  std::__cxx11::string::append((string *)&local_b0);
  std::__cxx11::string::append((char *)&local_b0);
  pcVar3 = cmMakefile::GetDefinition(this_00,&local_b0);
  if (pcVar3 != (char *)0x0) {
    std::__cxx11::string::assign((char *)local_70);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  cmsys::RegularExpression::compile
            (local_c0,"^[ \t]*#[ \t]*(include|import)[ \t]*[<\"]([^\">]+)([\">])");
  cmsys::RegularExpression::compile(local_c8,local_50[0]);
  cmsys::RegularExpression::compile(local_d0,local_70[0]);
  std::__cxx11::string::assign((char *)local_d8);
  std::__cxx11::string::assign((char *)&this->IncludeRegexScanString);
  std::__cxx11::string::append((string *)&this->IncludeRegexScanString);
  std::__cxx11::string::assign((char *)&this->IncludeRegexComplainString);
  std::__cxx11::string::append((string *)&this->IncludeRegexComplainString);
  SetupTransforms(this);
  std::__cxx11::string::_M_assign((string *)psVar2);
  std::__cxx11::string::append((char *)psVar2);
  std::__cxx11::string::append((string *)psVar2);
  std::__cxx11::string::append((char *)psVar2);
  ReadCacheFile(this);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

cmDependsC::cmDependsC(cmLocalGenerator* lg,
                   const char* targetDir,
                   const std::string& lang,
                   const std::map<std::string, DependencyVector>* validDeps)
: cmDepends(lg, targetDir)
, ValidDeps(validDeps)
{
  cmMakefile* mf = lg->GetMakefile();

  // Configure the include file search path.
  this->SetIncludePathFromLanguage(lang);

  // Configure regular expressions.
  std::string scanRegex = "^.*$";
  std::string complainRegex = "^$";
  {
  std::string scanRegexVar = "CMAKE_";
  scanRegexVar += lang;
  scanRegexVar += "_INCLUDE_REGEX_SCAN";
  if(const char* sr = mf->GetDefinition(scanRegexVar))
    {
    scanRegex = sr;
    }
  std::string complainRegexVar = "CMAKE_";
  complainRegexVar += lang;
  complainRegexVar += "_INCLUDE_REGEX_COMPLAIN";
  if(const char* cr = mf->GetDefinition(complainRegexVar))
    {
    complainRegex = cr;
    }
  }

  this->IncludeRegexLine.compile(INCLUDE_REGEX_LINE);
  this->IncludeRegexScan.compile(scanRegex.c_str());
  this->IncludeRegexComplain.compile(complainRegex.c_str());
  this->IncludeRegexLineString = INCLUDE_REGEX_LINE_MARKER INCLUDE_REGEX_LINE;
  this->IncludeRegexScanString = INCLUDE_REGEX_SCAN_MARKER;
  this->IncludeRegexScanString += scanRegex;
  this->IncludeRegexComplainString = INCLUDE_REGEX_COMPLAIN_MARKER;
  this->IncludeRegexComplainString += complainRegex;

  this->SetupTransforms();

  this->CacheFileName = this->TargetDirectory;
  this->CacheFileName += "/";
  this->CacheFileName += lang;
  this->CacheFileName += ".includecache";

  this->ReadCacheFile();
}